

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::LoadOffsetInst::display(LoadOffsetInst *this,ostream *o)

{
  ostream *poVar1;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  poVar1 = std::operator<<(o," = load ");
  poVar1 = std::operator<<(poVar1,"[ ");
  (**(this->src).super_Displayable._vptr_Displayable)(&this->src,poVar1);
  poVar1 = std::operator<<(poVar1," , ");
  (**(this->offset).super_Displayable._vptr_Displayable)(&this->offset,poVar1);
  std::operator<<(poVar1," ]");
  return;
}

Assistant:

void LoadOffsetInst::display(std::ostream& o) const {
  o << dest << " = load "
    << "[ " << src << " , " << offset << " ]";
}